

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_info.cpp
# Opt level: O2

void test(void)

{
  ostream *poVar1;
  tuple<int,_int,_int> info;
  int local_1c;
  int local_18;
  int local_14;
  
  get_running_sleeping_total_threads();
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
  poVar1 = std::operator<<(poVar1,",");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void test() {
    auto info = get_running_sleeping_total_threads();
    std::cout << std::get<0>(info) << "," << std::get<1>(info)
        << "," << std::get<2>(info) << std::endl;
}